

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O2

categories_collection *
pstore::command_line::details::build_categories
          (categories_collection *__return_storage_ptr__,option *self,options_container *all)

{
  _Rb_tree_header *p_Var1;
  option *poVar2;
  int iVar3;
  undefined4 extraout_var;
  _Rb_tree<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::gsl::not_null<pstore::command_line::option_const*>,std::_Identity<pstore::gsl::not_null<pstore::command_line::option_const*>>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>
  *this;
  _List_node_base *p_Var4;
  not_null<const_pstore::command_line::option_*> local_40;
  key_type local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (_List_node_base *)all;
  while (p_Var4 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)all) {
    poVar2 = (option *)p_Var4[1]._M_next;
    if (poVar2 != self) {
      iVar3 = (*poVar2->_vptr_option[9])(poVar2);
      if ((char)iVar3 == '\0') {
        iVar3 = (*poVar2->_vptr_option[7])(poVar2);
        local_38 = (key_type)CONCAT44(extraout_var,iVar3);
        this = (_Rb_tree<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::gsl::not_null<pstore::command_line::option_const*>,std::_Identity<pstore::gsl::not_null<pstore::command_line::option_const*>>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>
                *)std::
                  map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
                  ::operator[](__return_storage_ptr__,&local_38);
        local_40.ptr_ = poVar2;
        gsl::not_null<const_pstore::command_line::option_*>::ensure_invariant(&local_40);
        std::
        _Rb_tree<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::gsl::not_null<pstore::command_line::option_const*>,std::_Identity<pstore::gsl::not_null<pstore::command_line::option_const*>>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>
        ::_M_insert_unique<pstore::gsl::not_null<pstore::command_line::option_const*>>
                  (this,&local_40);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

categories_collection build_categories (option const * const self,
                                                        option::options_container const & all) {
                    categories_collection categories;
                    for (option const * const op : all) {
                        if (op != self && !op->is_positional ()) {
                            categories[op->category ()].insert (op);
                        }
                    }
                    return categories;
                }